

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cc
# Opt level: O0

int OpenConfigAndCountWords(void)

{
  bool bVar1;
  type pbVar2;
  istream *piVar3;
  string sink;
  int count;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  input;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  allocator *filename;
  string local_70 [36];
  int local_4c;
  undefined4 local_48;
  allocator local_31;
  string local_30 [44];
  int local_4;
  
  filename = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"CMakeLists.txt",filename);
  FileFactory::ReadFile((string *)filename);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)0x1093c3);
  if (bVar1) {
    local_4c = 0;
    std::__cxx11::string::string(local_70);
    while( true ) {
      pbVar2 = std::
               unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      piVar3 = std::operator>>((istream *)pbVar2,local_70);
      in_stack_ffffffffffffff77 =
           std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!(bool)in_stack_ffffffffffffff77) break;
      local_4c = local_4c + 1;
    }
    local_4 = local_4c;
    local_48 = 1;
    std::__cxx11::string::~string(local_70);
  }
  else {
    local_4 = -1;
    local_48 = 1;
  }
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  return local_4;
}

Assistant:

int OpenConfigAndCountWords() {
  const auto input = FileFactory::ReadFile("CMakeLists.txt");
  if (!input) {
    return -1;
  } else {
    int count = 0;
    std::string sink;
    while ((*input >> sink)) {
      ++count;
    }
    return count;
  }
}